

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestrictionsConfig.h
# Opt level: O1

RestrictionsConfig *
jaegertracing::baggage::RestrictionsConfig::parse
          (RestrictionsConfig *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  int iVar2;
  char (*in_R8) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hostPort;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  
  if ((configYAML->m_isValid == true) &&
     (((configYAML->m_pNode == (node *)0x0 ||
       (*(char *)**(undefined8 **)configYAML->m_pNode == '\x01')) &&
      (bVar1 = YAML::Node::IsMap(configYAML), bVar1)))) {
    local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffffffffff00;
    bVar1 = utils::yaml::findOrDefault<bool,char[35],bool>
                      (configYAML,(char (*) [35])"denyBaggageOnInitializationFailure",
                       (bool *)&local_40);
    utils::yaml::findOrDefault<std::__cxx11::string,char[9],char[1]>
              (&local_40,(yaml *)configYAML,(Node *)"hostPort",(char (*) [9])0x1e6ee4,in_R8);
    local_1c = 0;
    iVar2 = utils::yaml::findOrDefault<int,char[16],int>
                      (configYAML,(char (*) [16])"refreshInterval",&local_1c);
    __return_storage_ptr__->_denyBaggageOnInitializationFailure = bVar1;
    (__return_storage_ptr__->_hostPort)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_hostPort).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->_hostPort,local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
    (__return_storage_ptr__->_refreshInterval).__r = (long)iVar2 * 1000000000;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    __return_storage_ptr__->_denyBaggageOnInitializationFailure = false;
    (__return_storage_ptr__->_hostPort)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_hostPort).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->_hostPort,local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
    (__return_storage_ptr__->_refreshInterval).__r = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_40._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

static RestrictionsConfig parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return RestrictionsConfig();
        }

        const auto denyBaggageOnInitializationFailure =
            utils::yaml::findOrDefault<bool>(
                configYAML, "denyBaggageOnInitializationFailure", false);
        const auto hostPort =
            utils::yaml::findOrDefault<std::string>(configYAML, "hostPort", "");
        const auto refreshInterval = std::chrono::seconds(
            utils::yaml::findOrDefault<int>(configYAML, "refreshInterval", 0));
        return RestrictionsConfig(
            denyBaggageOnInitializationFailure, hostPort, refreshInterval);
    }